

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ulong *puVar3;
  SerialArena *this;
  __int_type_conflict _Var4;
  __pointer_type pSVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  Rep *pRVar9;
  ushort *p;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  string *s;
  ushort *ptr_00;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar11;
  string *psVar12;
  uint uVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  uint64_t uVar17;
  uint uVar18;
  pair<const_char_*,_int> pVar19;
  pair<const_char_*,_unsigned_int> pVar20;
  string_view wire_bytes;
  string_view wire_bytes_00;
  LogMessageFatal local_40 [16];
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  uVar7 = data.field_0._0_4_;
  if ((uVar7 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0015c215;
  }
  uVar18 = *(ushort *)(table_00.data + 10) & 0x1c0;
  if (uVar18 != 0x100) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x8f1);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_40,0x21,"Unsupported repeated string rep: ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_40,(unsigned_short)uVar18);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00);
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar18 = *(ushort *)(table_00.data + 10) & 0x600;
  puVar3 = (ulong *)this_00[2].data;
  uVar17 = hasbits;
  ptr_00 = (ushort *)ptr;
  if (puVar3 == (ulong *)0x0) {
LAB_0015c131:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_01;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0015c22d;
      ptr_00 = (ushort *)(s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)ptr_00;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar18,(uint16_t)uVar17
                          );
      ctx_00 = extraout_RDX_02;
      if (!bVar6) goto LAB_0015c22d;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0015c29a;
      bVar1 = (byte)*(ushort *)ptr;
      uVar13 = (uint)bVar1;
      ptr_00 = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)ptr_00;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar20 = ReadTagFallback(ptr,uVar13);
          uVar13 = pVar20.second;
          ptr_00 = (ushort *)pVar20.first;
        }
        else {
          ptr_00 = (ushort *)((long)ptr + 2);
        }
      }
      p = (ushort *)ptr;
    } while (uVar13 == uVar7);
  }
  else {
    lVar8 = __tls_get_addr(&PTR_001b3f20);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar8 + 8))->data;
    if (data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) goto LAB_0015c131;
    this = *(SerialArena **)(lVar8 + 0x10);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar13 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar13 = pRVar9->allocated_size;
    }
    if (uVar13 != *(uint *)(this_00 + 1)) goto LAB_0015c131;
    do {
      bVar1 = (byte)*(ushort *)ptr;
      ptr_00 = (ushort *)(ulong)bVar1;
      uVar13 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar19 = ReadSizeFallback(ptr,(uint)bVar1);
        ctx_00 = pVar19._8_8_;
        if ((ushort *)pVar19.first == (ushort *)0x0) {
LAB_0015c22d:
          pcVar11 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
          return pcVar11;
        }
        uVar13 = pVar19.second;
        ptr_00 = (ushort *)pVar19.first;
      }
      else {
        ptr_00 = (ushort *)((long)ptr + 1);
      }
      _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var4 == 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        uVar15 = _Var4 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar15;
        pSVar5 = (this->string_block_)._M_b._M_p;
        uVar14 = (ulong)pSVar5->allocated_size_ - 0x10;
        if (uVar14 < uVar15) {
          psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              (uVar15,uVar14,"offset <= effective_size()");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                     ,0xa2,*(undefined8 *)(psVar12 + 8),*(undefined8 *)psVar12);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)&pSVar5[-1].next_ + _Var4);
      }
      *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
      *(undefined8 *)((long)data.field_0 + 8) = 0;
      *(undefined1 *)((long)data.field_0 + 0x10) = 0;
      RepeatedPtrFieldBase::AddAllocatedForParse
                ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
      p = (ushort *)
          EpsCopyInputStream::ReadString
                    (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar13,(string *)data.field_0);
      ctx_00 = extraout_RDX;
      if (p == (ushort *)0x0) goto LAB_0015c22d;
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      ptr_00 = (ushort *)(pVVar10->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)ptr_00;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)pVVar10->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar18,(uint16_t)uVar17
                          );
      ctx_00 = extraout_RDX_00;
      if (!bVar6) goto LAB_0015c22d;
      ptr = (char *)p;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_0015c29a;
      bVar1 = (byte)*p;
      uVar13 = (uint)bVar1;
      ptr = (char *)((long)p + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *ptr;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar20 = ReadTagFallback((char *)p,uVar13);
          uVar13 = pVar20.second;
          ptr = pVar20.first;
        }
        else {
          ptr = (char *)(p + 1);
        }
      }
    } while (uVar13 == uVar7);
  }
  ptr = (char *)p;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_0015c29a:
    if ((ulong)table->has_bits_offset != 0) {
      puVar16 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar16 & 3) != 0) {
        AlignFail();
      }
      *puVar16 = *puVar16 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar7 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar14 = (ulong)(uVar7 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar14);
LAB_0015c215:
  pcVar11 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (PROTOBUF_PREDICT_TRUE(
              arena != nullptr &&
              arena->impl_.GetSerialArenaFast(&serial_arena) &&
              field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr ||
                                     !MpVerifyUtf8(field[field.size() - 1],
                                                   table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (PROTOBUF_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}